

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-get.c
# Opt level: O2

cn_cbor * cn_cbor_index(cn_cbor *cb,uint idx)

{
  cn_cbor *pcVar1;
  cn_cbor **ppcVar2;
  bool bVar3;
  
  if (cb != (cn_cbor *)0x0) {
    ppcVar2 = &cb->first_child;
    while( true ) {
      pcVar1 = *ppcVar2;
      bVar3 = idx == 0;
      idx = idx - 1;
      if ((pcVar1 == (cn_cbor *)0x0) || (bVar3)) break;
      ppcVar2 = &pcVar1->next;
    }
    return pcVar1;
  }
  __assert_fail("cb",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/cn-cbor/repo/src/cn-get.c"
                ,0x3c,"cn_cbor *cn_cbor_index(const cn_cbor *, unsigned int)");
}

Assistant:

MYLIB_EXPORT
cn_cbor* cn_cbor_index(const cn_cbor* cb, unsigned int idx) {
  cn_cbor *cp;
  unsigned int i = 0;
  assert(cb);
  for (cp = cb->first_child; cp; cp = cp->next) {
    if (i == idx) {
      return cp;
    }
    i++;
  }
  return NULL;
}